

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::ChangeModel(LTAircraft *this)

{
  bool bVar1;
  logLevelTy lVar2;
  string *psVar3;
  FlightModel *pFVar4;
  Doc8643 *pDVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_RDI;
  string *psVar9;
  string oldModelName;
  string oldIcaotype;
  FDStaticData statData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  Aircraft *in_stack_fffffffffffffb70;
  FDStaticData *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  Aircraft *in_stack_fffffffffffffbc0;
  LTFlightData *in_stack_fffffffffffffbc8;
  FDStaticData *in_stack_fffffffffffffbe8;
  LTAircraft *in_stack_fffffffffffffbf0;
  string **in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined1 bForceSearch;
  LTFlightData *in_stack_fffffffffffffc18;
  string *local_3b0;
  string *psVar10;
  string local_350 [32];
  string local_330 [32];
  string *local_310;
  undefined8 local_308;
  string local_300 [32];
  string *local_2e0;
  string local_2d8 [32];
  undefined1 local_2b8 [32];
  string *local_298;
  undefined8 local_290;
  string local_288 [32];
  string *local_268;
  string local_260 [32];
  string local_240 [32];
  string *local_220;
  undefined8 local_218;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  undefined4 local_1b0;
  string local_1a0 [64];
  string local_160 [352];
  
  LTFlightData::FDStaticData::FDStaticData((FDStaticData *)in_stack_fffffffffffffb70);
  bVar1 = LTFlightData::TryGetSafeCopy
                    (in_stack_fffffffffffffbc8,(FDStaticData *)in_stack_fffffffffffffbc0);
  if (bVar1) {
    std::__cxx11::string::string(local_1d0,(string *)(in_RDI + 0x10));
    psVar3 = XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffffb70);
    std::__cxx11::string::string(local_1f0,(string *)psVar3);
    local_268 = local_260;
    std::__cxx11::string::string(local_268,(string *)&dataRefs.cslFixAcIcaoType);
    local_268 = local_240;
    std::__cxx11::string::string(local_268,local_160);
    local_220 = local_260;
    local_218 = 2;
    str_first_non_empty((initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffbb8);
    local_2e0 = local_2d8;
    std::__cxx11::string::string(local_2e0,(string *)&dataRefs.cslFixOpIcao);
    local_2e0 = (string *)local_2b8;
    LTFlightData::FDStaticData::airlineCode_abi_cxx11_(in_stack_fffffffffffffb78);
    local_298 = local_2d8;
    local_290 = 2;
    str_first_non_empty((initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffbb8);
    std::__cxx11::string::string(local_350,(string *)&dataRefs.cslFixLivery);
    std::__cxx11::string::string(local_330,local_1a0);
    local_310 = local_350;
    local_308 = 2;
    str_first_non_empty((initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffbb8);
    XPMP2::Aircraft::ChangeModel
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffba8);
    std::__cxx11::string::~string(local_300);
    psVar10 = local_350;
    psVar9 = (string *)&local_310;
    do {
      psVar9 = psVar9 + -0x20;
      std::__cxx11::string::~string(psVar9);
    } while (psVar9 != psVar10);
    std::__cxx11::string::~string(local_288);
    psVar10 = local_2d8;
    psVar9 = (string *)&local_298;
    do {
      psVar9 = psVar9 + -0x20;
      std::__cxx11::string::~string(psVar9);
    } while (psVar9 != psVar10);
    std::__cxx11::string::~string(local_210);
    local_3b0 = (string *)&local_220;
    do {
      local_3b0 = local_3b0 + -0x20;
      std::__cxx11::string::~string(local_3b0);
      bForceSearch = (undefined1)((ulong)in_stack_fffffffffffffc10 >> 0x38);
    } while (local_3b0 != local_260);
    CalcLabelInternal(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffffb70);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    if ((bVar1) ||
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb70,in_stack_fffffffffffffb68), bVar1)) {
      pFVar4 = FlightModel::FindFlightModel
                         (in_stack_fffffffffffffc18,(bool)bForceSearch,in_stack_fffffffffffffc08);
      *(FlightModel **)(in_RDI + 0x350) = pFVar4;
      pDVar5 = Doc8643::get(&in_stack_fffffffffffffb78->reg);
      *(Doc8643 **)(in_RDI + 0x358) = pDVar5;
      bVar1 = LTFlightData::FDStaticData::isStaticObject((FDStaticData *)0x19b8bf);
      *(bool *)(in_RDI + 0x360) = bVar1;
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 2) {
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffffb70);
        in_stack_fffffffffffffb70 = (Aircraft *)std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
               ,0xbc1,"ChangeModel",logINFO,
               "Changed CSL model for aircraft %s, operator \'%s\': a/c model now \'%s\' (Flight model \'%s\')"
               ,uVar6,uVar7,in_stack_fffffffffffffb70,uVar8);
      }
    }
    *(undefined1 *)(in_RDI + 0x8e0) = 0;
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_1d0);
    local_1b0 = 0;
  }
  else {
    local_1b0 = 1;
  }
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffffb70);
  return;
}

Assistant:

void LTAircraft::ChangeModel ()
{
    // Try to fetch the static data
    LTFlightData::FDStaticData statData;
    if (!fd.TryGetSafeCopy(statData))
        return;
    
    // Save previous model name to identify an actual change
    const std::string oldIcaotype(acIcaoType);
    const std::string oldModelName(GetModelName());
    XPMP2::Aircraft::ChangeModel(str_first_non_empty({dataRefs.cslFixAcIcaoType, statData.acTypeIcao}),
                                 str_first_non_empty({dataRefs.cslFixOpIcao,     statData.airlineCode()}),
                                 str_first_non_empty({dataRefs.cslFixLivery,     statData.reg}));
    CalcLabelInternal(statData);

    // if there was an actual change inform the log
    if (oldModelName != GetModelName() ||
        oldIcaotype  != acIcaoType) {
        // also update the flight model to be used
        pMdl = &FlightModel::FindFlightModel(fd, true);
        pDoc8643 = &Doc8643::get(acIcaoType);
        bStaticObject = statData.isStaticObject();
        LOG_MSG(logINFO,INFO_AC_MDL_CHANGED,
                labelInternal.c_str(),
                statData.opIcao.c_str(),
                GetModelName().c_str(), pMdl->modelName.c_str());
    }
    
    // reset the flag that we needed to change the model
    bChangeModel = false;
}